

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction_tests.cpp
# Opt level: O1

uint ParseScriptFlags(string strFlags)

{
  int iVar1;
  const_iterator cVar2;
  mapped_type_conflict *pmVar3;
  uint uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  iterator in_R8;
  iterator in_R9;
  pointer __k;
  long in_FS_OFFSET;
  const_string file;
  const_string msg;
  string_view separators;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  words;
  check_type cVar5;
  char *local_f8;
  char *local_f0;
  undefined **local_e8;
  undefined1 local_e0;
  undefined1 *local_d8;
  char *local_d0;
  undefined **local_c8;
  undefined1 local_c0;
  undefined ***local_b8;
  key_type *local_b0;
  lazy_ostream local_a8;
  undefined ***local_98;
  char *local_90;
  assertion_result local_88;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = 0;
  if ((in_RDI->_M_string_length != 0) &&
     (iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(in_RDI,"NONE"), uVar4 = 0, iVar1 != 0)) {
    local_a8._vptr_lazy_ostream = (_func_int **)(in_RDI->_M_dataplus)._M_p;
    local_a8._8_8_ = in_RDI->_M_string_length;
    local_c8 = (undefined **)CONCAT71(local_c8._1_7_,0x2c);
    separators._M_str = in_R8;
    separators._M_len = (size_t)&local_c8;
    util::Split<std::__cxx11::string>
              (&local_50,(util *)&local_a8,(Span<const_char> *)0x1,separators);
    if (local_50.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_50.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      uVar4 = 0;
    }
    else {
      uVar4 = 0;
      __k = local_50.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
      do {
        cVar2 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                ::find(&mapFlagNames_abi_cxx11_._M_t,__k);
        if ((_Rb_tree_header *)cVar2._M_node ==
            &mapFlagNames_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
          local_60 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
          ;
          local_58 = "";
          local_70 = &boost::unit_test::basic_cstring<char_const>::null;
          local_68 = &boost::unit_test::basic_cstring<char_const>::null;
          file.m_end = (iterator)0x54;
          file.m_begin = (iterator)&local_60;
          msg.m_end = in_R9;
          msg.m_begin = in_R8;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_70,
                     msg);
          local_88.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value
               = (readonly_property<bool>)(class_property<bool>)0x0;
          local_88.m_message.px = (element_type *)0x0;
          local_88.m_message.pn.pi_ = (sp_counted_base *)0x0;
          local_e0 = 0;
          local_e8 = &PTR__lazy_ostream_013acce0;
          local_d8 = boost::unit_test::lazy_ostream::inst;
          local_d0 = "Bad test: unknown verification flag \'";
          local_c0 = 0;
          local_c8 = &PTR__lazy_ostream_013b0518;
          local_b8 = &local_e8;
          local_a8._8_8_ = local_a8._8_8_ & 0xffffffffffffff00;
          local_a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013b08f0;
          local_98 = &local_c8;
          local_90 = "\'";
          local_f8 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
          ;
          local_f0 = "";
          in_R8 = (iterator)0x1;
          in_R9 = (iterator)0x1;
          local_b0 = __k;
          boost::test_tools::tt_detail::report_assertion
                    (&local_88,&local_a8,1,1,WARN,_cVar5,(size_t)&local_f8,0x54);
          boost::detail::shared_count::~shared_count(&local_88.m_message.pn);
        }
        pmVar3 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 ::operator[](&mapFlagNames_abi_cxx11_,__k);
        uVar4 = uVar4 | *pmVar3;
        __k = __k + 1;
      } while (__k != local_50.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_50);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return uVar4;
}

Assistant:

unsigned int ParseScriptFlags(std::string strFlags)
{
    unsigned int flags = SCRIPT_VERIFY_NONE;
    if (strFlags.empty() || strFlags == "NONE") return flags;

    std::vector<std::string> words = SplitString(strFlags, ',');
    for (const std::string& word : words)
    {
        if (!mapFlagNames.count(word))
            BOOST_ERROR("Bad test: unknown verification flag '" << word << "'");
        flags |= mapFlagNames[word];
    }
    return flags;
}